

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall defyx::JitCompilerX86::JitCompilerX86(JitCompilerX86 *this)

{
  uint8_t *__dest;
  
  (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __dest = (uint8_t *)allocExecutableMemory(0x7000);
  this->code = __dest;
  memcpy(__dest,codePrologue,(long)prologueSize);
  memcpy(this->code + epilogueOffset,codeEpilogue,(long)epilogueSize);
  return;
}

Assistant:

JitCompilerX86::JitCompilerX86() {
		code = (uint8_t*)allocExecutableMemory(CodeSize);
		memcpy(code, codePrologue, prologueSize);
		memcpy(code + epilogueOffset, codeEpilogue, epilogueSize);
	}